

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTFExporter.cpp
# Opt level: O0

Ref<glTF::Accessor>
ExportData(Asset *a,string *meshName,Ref<glTF::Buffer> *buffer,uint count,void *data,Value typeIn,
          Value typeOut,ComponentType compType,bool isIndices)

{
  ulong uVar1;
  undefined8 uVar2;
  uint numCompsIn_00;
  uint numCompsOut_00;
  uint uVar3;
  Buffer *pBVar4;
  BufferView *pBVar5;
  Accessor *pAVar6;
  ulong uVar7;
  Ref<glTF::BufferView> RVar8;
  Ref<glTF::Accessor> RVar9;
  Ref<glTF::Accessor> RVar10;
  string local_e0;
  vector<glTF::BufferView_*,_std::allocator<glTF::BufferView_*>_> *local_c0;
  uint local_b8;
  string local_a0;
  undefined1 local_80 [8];
  Ref<glTF::BufferView> bv;
  size_t length;
  size_t padding;
  size_t offset;
  uint bytesPerComp;
  uint numCompsOut;
  uint numCompsIn;
  bool isIndices_local;
  Value typeIn_local;
  void *data_local;
  uint count_local;
  Ref<glTF::Buffer> *buffer_local;
  string *meshName_local;
  Asset *a_local;
  Ref<glTF::Accessor> acc;
  
  if ((count == 0) || (data == (void *)0x0)) {
    glTF::Ref<glTF::Accessor>::Ref((Ref<glTF::Accessor> *)&a_local);
  }
  else {
    numCompsIn_00 = glTF::AttribType::GetNumComponents(typeIn);
    numCompsOut_00 = glTF::AttribType::GetNumComponents(typeOut);
    uVar3 = glTF::ComponentTypeSize(compType);
    pBVar4 = glTF::Ref<glTF::Buffer>::operator->(buffer);
    uVar1 = pBVar4->byteLength;
    uVar7 = uVar1 % (ulong)uVar3;
    bv._8_8_ = ZEXT48(count * numCompsOut_00 * uVar3);
    pBVar4 = glTF::Ref<glTF::Buffer>::operator->(buffer);
    glTF::Buffer::Grow(pBVar4,bv._8_8_ + uVar7);
    glTF::Asset::FindUniqueID(&local_a0,a,meshName,"view");
    RVar8 = glTF::LazyDict<glTF::BufferView>::Create(&a->bufferViews,&local_a0);
    local_c0 = RVar8.vector;
    local_b8 = RVar8.index;
    local_80 = (undefined1  [8])local_c0;
    bv.vector._0_4_ = local_b8;
    std::__cxx11::string::~string((string *)&local_a0);
    pBVar5 = glTF::Ref<glTF::BufferView>::operator->((Ref<glTF::BufferView> *)local_80);
    (pBVar5->buffer).index = buffer->index;
    (pBVar5->buffer).vector = buffer->vector;
    pBVar5 = glTF::Ref<glTF::BufferView>::operator->((Ref<glTF::BufferView> *)local_80);
    uVar2 = bv._8_8_;
    pBVar5->byteOffset = uVar1 + uVar7 & 0xffffffff;
    pBVar5 = glTF::Ref<glTF::BufferView>::operator->((Ref<glTF::BufferView> *)local_80);
    pBVar5->byteLength = uVar2;
    pBVar5 = glTF::Ref<glTF::BufferView>::operator->((Ref<glTF::BufferView> *)local_80);
    pBVar5->target = isIndices & 1 | BufferViewTarget_ARRAY_BUFFER;
    glTF::Asset::FindUniqueID(&local_e0,a,meshName,"accessor");
    RVar9 = glTF::LazyDict<glTF::Accessor>::Create(&a->accessors,&local_e0);
    a_local = (Asset *)RVar9.vector;
    acc.vector._0_4_ = RVar9.index;
    std::__cxx11::string::~string((string *)&local_e0);
    pAVar6 = glTF::Ref<glTF::Accessor>::operator->((Ref<glTF::Accessor> *)&a_local);
    (pAVar6->bufferView).vector =
         (vector<glTF::BufferView_*,_std::allocator<glTF::BufferView_*>_> *)local_80;
    (pAVar6->bufferView).index = (uint)bv.vector;
    pAVar6 = glTF::Ref<glTF::Accessor>::operator->((Ref<glTF::Accessor> *)&a_local);
    pAVar6->byteOffset = 0;
    pAVar6 = glTF::Ref<glTF::Accessor>::operator->((Ref<glTF::Accessor> *)&a_local);
    pAVar6->byteStride = 0;
    pAVar6 = glTF::Ref<glTF::Accessor>::operator->((Ref<glTF::Accessor> *)&a_local);
    pAVar6->componentType = compType;
    pAVar6 = glTF::Ref<glTF::Accessor>::operator->((Ref<glTF::Accessor> *)&a_local);
    pAVar6->count = count;
    pAVar6 = glTF::Ref<glTF::Accessor>::operator->((Ref<glTF::Accessor> *)&a_local);
    pAVar6->type = typeOut;
    RVar9.index = (uint)acc.vector;
    RVar9.vector = (vector<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_> *)a_local;
    RVar9._12_4_ = 0;
    SetAccessorRange(compType,RVar9,data,count,numCompsIn_00,numCompsOut_00);
    pAVar6 = glTF::Ref<glTF::Accessor>::operator->((Ref<glTF::Accessor> *)&a_local);
    glTF::Accessor::WriteData(pAVar6,(ulong)count,data,(ulong)(numCompsIn_00 * uVar3));
  }
  RVar10.index = (uint)acc.vector;
  RVar10.vector = (vector<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_> *)a_local;
  RVar10._12_4_ = 0;
  return RVar10;
}

Assistant:

inline Ref<Accessor> ExportData(Asset& a, std::string& meshName, Ref<Buffer>& buffer,
    unsigned int count, void* data, AttribType::Value typeIn, AttribType::Value typeOut, ComponentType compType, bool isIndices = false)
{
    if (!count || !data) return Ref<Accessor>();

    unsigned int numCompsIn = AttribType::GetNumComponents(typeIn);
    unsigned int numCompsOut = AttribType::GetNumComponents(typeOut);
    unsigned int bytesPerComp = ComponentTypeSize(compType);

    size_t offset = buffer->byteLength;
    // make sure offset is correctly byte-aligned, as required by spec
    size_t padding = offset % bytesPerComp;
    offset += padding;
    size_t length = count * numCompsOut * bytesPerComp;
    buffer->Grow(length + padding);

    // bufferView
    Ref<BufferView> bv = a.bufferViews.Create(a.FindUniqueID(meshName, "view"));
    bv->buffer = buffer;
    bv->byteOffset = unsigned(offset);
    bv->byteLength = length; //! The target that the WebGL buffer should be bound to.
    bv->target = isIndices ? BufferViewTarget_ELEMENT_ARRAY_BUFFER : BufferViewTarget_ARRAY_BUFFER;

    // accessor
    Ref<Accessor> acc = a.accessors.Create(a.FindUniqueID(meshName, "accessor"));
    acc->bufferView = bv;
    acc->byteOffset = 0;
    acc->byteStride = 0;
    acc->componentType = compType;
    acc->count = count;
    acc->type = typeOut;

    // calculate min and max values
	SetAccessorRange(compType, acc, data, count, numCompsIn, numCompsOut);

    // copy the data
    acc->WriteData(count, data, numCompsIn*bytesPerComp);

    return acc;
}